

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O2

bool __thiscall basisu::basis_compressor::validate_ktx2_constraints(basis_compressor *this)

{
  basisu_backend_slice_desc_vec *this_00;
  uint32_t uVar1;
  uint uVar2;
  basisu_backend_slice_desc *pbVar3;
  uint *puVar4;
  uint uVar5;
  uint32_t i_1;
  uint32_t uVar6;
  uint32_t uVar7;
  ulong uVar8;
  uint32_t i_2;
  uint32_t i;
  ulong uVar9;
  bool bVar10;
  vector<unsigned_int> total_mips;
  
  this_00 = &this->m_slice_descs;
  uVar6 = 0;
  uVar1 = 0;
  uVar5 = 0;
  for (uVar9 = 0; uVar9 < (this->m_slice_descs).m_size; uVar9 = uVar9 + 1) {
    pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,uVar9);
    if (pbVar3->m_mip_index == 0) {
      pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,uVar9);
      uVar7 = pbVar3->m_orig_width;
      if (uVar6 == 0) {
        pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,uVar9);
        uVar1 = pbVar3->m_orig_height;
      }
      else if ((uVar7 != uVar6) ||
              (pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,uVar9),
              uVar7 = uVar6, pbVar3->m_orig_height != uVar1)) {
        return false;
      }
      pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,uVar9);
      uVar2 = pbVar3->m_source_file_index + 1;
      uVar6 = uVar7;
      if (uVar5 <= uVar2) {
        uVar5 = uVar2;
      }
    }
  }
  uVar9 = (ulong)uVar5;
  vector<unsigned_int>::vector(&total_mips,uVar9);
  for (uVar8 = 0; uVar8 < (this->m_slice_descs).m_size; uVar8 = uVar8 + 1) {
    pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,uVar8);
    puVar4 = vector<unsigned_int>::operator[](&total_mips,(ulong)pbVar3->m_source_file_index);
    uVar5 = *puVar4;
    pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,uVar8);
    uVar2 = pbVar3->m_mip_index + 1;
    if (uVar2 < uVar5) {
      uVar2 = uVar5;
    }
    pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,uVar8);
    puVar4 = vector<unsigned_int>::operator[](&total_mips,(ulong)pbVar3->m_source_file_index);
    *puVar4 = uVar2;
  }
  uVar8 = 1;
  do {
    bVar10 = uVar9 <= uVar8;
    if (bVar10) break;
    puVar4 = vector<unsigned_int>::operator[](&total_mips,0);
    uVar5 = *puVar4;
    puVar4 = vector<unsigned_int>::operator[](&total_mips,uVar8);
    uVar8 = uVar8 + 1;
  } while (uVar5 == *puVar4);
  free(total_mips.m_p);
  return bVar10;
}

Assistant:

bool basis_compressor::validate_ktx2_constraints()
	{
		uint32_t base_width = 0, base_height = 0;
		uint32_t total_layers = 0;
		for (uint32_t i = 0; i < m_slice_descs.size(); i++)
		{
			if (m_slice_descs[i].m_mip_index == 0)
			{
				if (!base_width)
				{
					base_width = m_slice_descs[i].m_orig_width;
					base_height = m_slice_descs[i].m_orig_height;
				}
				else
				{
					if ((m_slice_descs[i].m_orig_width != base_width) || (m_slice_descs[i].m_orig_height != base_height))
					{
						return false;
					}
				}

				total_layers = maximum<uint32_t>(total_layers, m_slice_descs[i].m_source_file_index + 1);
			}
		}

		basisu::vector<uint32_t> total_mips(total_layers);
		for (uint32_t i = 0; i < m_slice_descs.size(); i++)
			total_mips[m_slice_descs[i].m_source_file_index] = maximum<uint32_t>(total_mips[m_slice_descs[i].m_source_file_index], m_slice_descs[i].m_mip_index + 1);

		for (uint32_t i = 1; i < total_layers; i++)
		{
			if (total_mips[0] != total_mips[i])
			{
				return false;
			}
		}

		return true;
	}